

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyper_log_log.hxx
# Opt level: O2

size_type __thiscall hll::hyper_log_log<int,_12UL>::count(hyper_log_log<int,_12UL> *this)

{
  long lVar1;
  difference_type dVar2;
  undefined4 local_1c;
  double local_18;
  undefined8 uStack_10;
  
  local_18 = 0.0;
  for (lVar1 = 0; lVar1 != 0x1000; lVar1 = lVar1 + 1) {
    local_18 = local_18 +
               (double)(((ulong)(byte)(this->m_registers)._M_elems[lVar1] ^ 0x3ff) << 0x34);
  }
  local_18 = 12098218.894406674 / local_18;
  if (local_18 <= 10240.0) {
    local_1c = 0;
    uStack_10 = 0;
    dVar2 = std::__count_if<signed_char_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      ((char *)this,(char *)(this + 1),(_Iter_equals_val<const_int>)&local_1c);
    if (0 < dVar2) {
      local_18 = log(4096.0 / (double)dVar2);
      local_18 = local_18 * 4096.0;
    }
  }
  else if (143165576.53333333 < local_18) {
    local_18 = log(local_18 * -2.3283064365386963e-10 + 1.0);
    local_18 = local_18 * -4294967296.0;
  }
  return (long)(local_18 - 9.223372036854776e+18) & (long)local_18 >> 0x3f | (long)local_18;
}

Assistant:

HLL_CONSTEXPR_OR_INLINE auto hyper_log_log<T, k>::count() const
-> typename hyper_log_log<T, k>::size_type
{
    constexpr double TWO_32_POWER = 0x100000000;
    double count = 0;

    for (const auto& element : m_registers)
        count += 1.0 / (1u << element);

    // Оценка количества элементов
    auto estimation = alpha_m_squared / count;

    // корректировка результатов в зависимости от размеров оценки
    if (estimation <= 2.5 * registers_count)
    {
        const auto zero_registers_count = std::count(m_registers.begin(), m_registers.end(), 0);

        if (zero_registers_count > 0)
            // если хотя бы один регистр "пустой", то используем linear counting
            estimation = registers_count * std::log(static_cast<double>(registers_count) / zero_registers_count);
    } else if (estimation > (TWO_32_POWER / 30.0))
    { // если оценка получилась довольно большой
        estimation = -TWO_32_POWER * std::log(1.0 - (estimation / TWO_32_POWER));
    }

    return static_cast<size_type>(estimation);
}